

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  uint uVar1;
  stbi__context *psVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  stbi__uint32 sVar6;
  stbi_uc *psVar7;
  long lVar8;
  byte *pbVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar17;
  uint uVar18;
  byte bVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  stbi_uc *__dest;
  ulong uVar25;
  ulong uVar26;
  byte *pbVar27;
  bool bVar28;
  stbi_uc *local_100;
  stbi_uc *local_e8;
  stbi__uint32 local_70;
  ulong uVar16;
  
  psVar2 = a->s;
  uVar1 = psVar2->img_n;
  if (uVar1 + 1 != out_n && uVar1 != out_n) {
    __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                  "/workspace/llm4binary/github/license_c_cmakelists/RayTracing[P]raytracing/src/external/stb_image.h"
                  ,0xf7e,
                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                 );
  }
  uVar15 = x * out_n;
  uVar16 = (ulong)uVar15;
  psVar7 = (stbi_uc *)malloc((ulong)(uVar15 * y));
  a->out = psVar7;
  if (psVar7 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "Out of memory";
    return 0;
  }
  uVar4 = uVar1 * x;
  uVar17 = uVar4 * depth + 7 >> 3;
  uVar5 = (uVar17 + 1) * y;
  if ((psVar2->img_x == x) && (psVar2->img_y == y)) {
    if (uVar5 != raw_len) goto LAB_0010f474;
  }
  else if (raw_len < uVar5) goto LAB_0010f474;
  lVar22 = -uVar16;
  lVar12 = (long)out_n;
  uVar25 = 0;
  if (0 < (int)uVar1) {
    uVar25 = (ulong)uVar1;
  }
  lVar23 = -lVar12;
  uVar5 = 0;
  uVar14 = 0;
  while( true ) {
    if (uVar14 == y) {
      if (7 < depth) {
        return 1;
      }
      uVar5 = 0;
      uVar25 = 0;
      do {
        if (uVar25 == y) {
          return 1;
        }
        bVar3 = 1;
        if (color == 0) {
          bVar3 = ""[(uint)depth];
        }
        uVar11 = (ulong)uVar5;
        psVar7 = a->out;
        uVar14 = (ulong)(uVar15 * (int)uVar25);
        if (depth == 4) {
          lVar12 = (uVar16 - uVar17) + uVar11;
          lVar22 = 0;
          for (uVar21 = uVar4; 1 < (int)uVar21; uVar21 = uVar21 - 2) {
            psVar7[lVar22 * 2 + uVar11] = (psVar7[lVar22 + lVar12] >> 4) * bVar3;
            psVar7[lVar22 * 2 + uVar11 + 1] = (psVar7[lVar22 + lVar12] & 0xf) * bVar3;
            lVar22 = lVar22 + 1;
          }
          if (uVar21 == 1) {
            psVar7[lVar22 * 2 + uVar11] = (psVar7[lVar22 + lVar12] >> 4) * bVar3;
          }
        }
        else {
          pbVar27 = psVar7 + ((uVar16 + uVar14) - (ulong)uVar17);
          if (depth == 2) {
            psVar7 = psVar7 + uVar11 + 3;
            for (uVar21 = uVar4; 3 < (int)uVar21; uVar21 = uVar21 - 4) {
              psVar7[-3] = (*pbVar27 >> 6) * bVar3;
              psVar7[-2] = (*pbVar27 >> 4 & 3) * bVar3;
              psVar7[-1] = (*pbVar27 >> 2 & 3) * bVar3;
              *psVar7 = (*pbVar27 & 3) * bVar3;
              pbVar27 = pbVar27 + 1;
              psVar7 = psVar7 + 4;
            }
            if (((0 < (int)uVar21) && (psVar7[-3] = (*pbVar27 >> 6) * bVar3, uVar21 != 1)) &&
               (psVar7[-2] = (*pbVar27 >> 4 & 3) * bVar3, uVar21 == 3)) {
              psVar7[-1] = (*pbVar27 >> 2 & 3) * bVar3;
            }
          }
          else if (depth == 1) {
            pbVar9 = psVar7 + uVar11 + 7;
            for (uVar21 = uVar4; 7 < (int)uVar21; uVar21 = uVar21 - 8) {
              pbVar9[-7] = (char)*pbVar27 >> 7 & bVar3;
              pbVar9[-6] = (char)(*pbVar27 * '\x02') >> 7 & bVar3;
              pbVar9[-5] = (char)(*pbVar27 << 2) >> 7 & bVar3;
              pbVar9[-4] = (char)(*pbVar27 << 3) >> 7 & bVar3;
              pbVar9[-3] = (char)(*pbVar27 << 4) >> 7 & bVar3;
              pbVar9[-2] = (char)(*pbVar27 << 5) >> 7 & bVar3;
              pbVar9[-1] = (char)(*pbVar27 << 6) >> 7 & bVar3;
              bVar19 = bVar3;
              if ((*pbVar27 & 1) == 0) {
                bVar19 = 0;
              }
              *pbVar9 = bVar19;
              pbVar27 = pbVar27 + 1;
              pbVar9 = pbVar9 + 8;
            }
            if (((((0 < (int)uVar21) && (pbVar9[-7] = (char)*pbVar27 >> 7 & bVar3, uVar21 != 1)) &&
                 ((pbVar9[-6] = (char)(*pbVar27 * '\x02') >> 7 & bVar3, 2 < uVar21 &&
                  ((pbVar9[-5] = (char)(*pbVar27 << 2) >> 7 & bVar3, uVar21 != 3 &&
                   (pbVar9[-4] = (char)(*pbVar27 << 3) >> 7 & bVar3, 4 < uVar21)))))) &&
                (pbVar9[-3] = (char)(*pbVar27 << 4) >> 7 & bVar3, uVar21 != 5)) &&
               (pbVar9[-2] = (char)(*pbVar27 << 5) >> 7 & bVar3, uVar21 == 7)) {
              pbVar9[-1] = (char)(*pbVar27 << 6) >> 7 & bVar3;
            }
          }
        }
        if (uVar1 != out_n) {
          psVar7 = a->out;
          if (uVar1 == 1) {
            uVar21 = x * 2 - 1;
            for (iVar20 = 0; -1 < (int)((x - 1) + iVar20); iVar20 = iVar20 + -1) {
              psVar7[uVar21 + uVar14] = 0xff;
              psVar7[(uVar21 - 1) + uVar14] = psVar7[((x - 1) + iVar20 & 0x7fffffff) + uVar14];
              uVar21 = uVar21 - 2;
            }
          }
          else {
            iVar20 = x - 1;
            uVar18 = x * 4;
            uVar21 = x * 3;
            if (uVar1 != 3) {
              __assert_fail("img_n == 3",
                            "/workspace/llm4binary/github/license_c_cmakelists/RayTracing[P]raytracing/src/external/stb_image.h"
                            ,0x1019,
                            "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                           );
            }
            while( true ) {
              uVar21 = uVar21 - 3;
              if (iVar20 < 0) break;
              psVar7[(uVar18 - 1) + uVar14] = 0xff;
              psVar7[(uVar18 - 2) + uVar14] = psVar7[(ulong)uVar21 + uVar14 + 2];
              psVar7[(uVar18 - 3) + uVar14] = psVar7[(ulong)uVar21 + uVar14 + 1];
              psVar7[(uVar18 - 4) + uVar14] = psVar7[uVar21 + uVar14];
              iVar20 = iVar20 + -1;
              uVar18 = uVar18 - 4;
            }
          }
        }
        uVar25 = uVar25 + 1;
        uVar5 = uVar5 + uVar15;
      } while( true );
    }
    uVar11 = (ulong)*raw;
    if (4 < uVar11) break;
    psVar7 = a->out;
    local_e8 = psVar7 + uVar15 * (int)uVar14;
    uVar21 = uVar1;
    local_100 = local_e8;
    local_70 = x;
    if (depth < 8) {
      if (x < uVar17) {
        __assert_fail("img_width_bytes <= x",
                      "/workspace/llm4binary/github/license_c_cmakelists/RayTracing[P]raytracing/src/external/stb_image.h"
                      ,0xf94,
                      "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                     );
      }
      local_100 = local_e8 + (uVar15 - uVar17);
      uVar21 = 1;
      local_70 = uVar17;
    }
    if (uVar14 == 0) {
      uVar11 = (ulong)""[uVar11];
    }
    uVar10 = (ulong)uVar5;
    uVar26 = 0;
    if (0 < (int)uVar21) {
      uVar26 = (ulong)uVar21;
    }
    lVar8 = uVar10 + lVar22;
    for (uVar24 = 0; uVar26 != uVar24; uVar24 = uVar24 + 1) {
      switch(uVar11) {
      case 0:
      case 1:
      case 5:
      case 6:
        bVar3 = raw[uVar24 + 1];
        break;
      case 2:
        bVar3 = psVar7[uVar24 + lVar8];
        goto LAB_0010f687;
      case 3:
        bVar3 = psVar7[uVar24 + lVar8] >> 1;
LAB_0010f687:
        bVar3 = bVar3 + raw[uVar24 + 1];
        break;
      case 4:
        bVar3 = raw[uVar24 + 1];
        iVar20 = stbi__paeth(0,(uint)psVar7[uVar24 + lVar8],0);
        bVar3 = (char)iVar20 + bVar3;
        break;
      default:
        goto switchD_0010f645_default;
      }
      local_100[uVar24] = bVar3;
switchD_0010f645_default:
    }
    if (depth == 8) {
      if (uVar1 != out_n) {
        local_100[(int)uVar1] = 0xff;
      }
      raw = raw + (long)(int)uVar1 + 1;
      lVar8 = lVar12;
    }
    else {
      raw = raw + 2;
      lVar8 = 1;
    }
    __dest = local_100 + lVar8;
    if (depth < 8 || uVar1 == out_n) {
      uVar18 = (local_70 - 1) * uVar1;
      if ((byte)uVar11 < 7) {
        lVar13 = (long)(int)uVar21;
        switch(uVar11) {
        case 0:
          memcpy(__dest,raw,(long)(int)uVar18);
          break;
        case 1:
          uVar21 = uVar18;
          if ((int)uVar18 < 1) {
            uVar21 = 0;
          }
          for (uVar11 = 0; uVar21 != uVar11; uVar11 = uVar11 + 1) {
            __dest[uVar11] = __dest[uVar11 - lVar13] + raw[uVar11];
          }
          break;
        case 2:
          uVar21 = uVar18;
          if ((int)uVar18 < 1) {
            uVar21 = 0;
          }
          for (uVar11 = 0; uVar21 != uVar11; uVar11 = uVar11 + 1) {
            __dest[uVar11] = psVar7[uVar11 + lVar8 + uVar10 + lVar22] + raw[uVar11];
          }
          break;
        case 3:
          uVar21 = uVar18;
          if ((int)uVar18 < 1) {
            uVar21 = 0;
          }
          for (uVar11 = 0; uVar21 != uVar11; uVar11 = uVar11 + 1) {
            __dest[uVar11] =
                 (char)((uint)__dest[uVar11 - lVar13] +
                        (uint)psVar7[uVar11 + lVar8 + uVar10 + lVar22] >> 1) + raw[uVar11];
          }
          break;
        case 4:
          uVar21 = uVar18;
          if ((int)uVar18 < 1) {
            uVar21 = 0;
          }
          uVar11 = (ulong)uVar21;
          pbVar9 = psVar7 + lVar8 + uVar10 + lVar22;
          pbVar27 = raw;
          while (bVar28 = uVar11 != 0, uVar11 = uVar11 - 1, bVar28) {
            bVar3 = *pbVar27;
            iVar20 = stbi__paeth((uint)__dest[-lVar13],(uint)*pbVar9,(uint)pbVar9[-lVar13]);
            *__dest = (char)iVar20 + bVar3;
            __dest = __dest + 1;
            pbVar9 = pbVar9 + 1;
            pbVar27 = pbVar27 + 1;
          }
          break;
        case 5:
          uVar21 = uVar18;
          if ((int)uVar18 < 1) {
            uVar21 = 0;
          }
          for (uVar11 = 0; uVar21 != uVar11; uVar11 = uVar11 + 1) {
            __dest[uVar11] = (__dest[uVar11 - lVar13] >> 1) + raw[uVar11];
          }
          break;
        case 6:
          uVar21 = uVar18;
          if ((int)uVar18 < 1) {
            uVar21 = 0;
          }
          for (uVar11 = 0; uVar21 != uVar11; uVar11 = uVar11 + 1) {
            __dest[uVar11] = __dest[uVar11 - lVar13] + raw[uVar11];
          }
        }
      }
      raw = raw + (int)uVar18;
    }
    else {
      if (uVar1 + 1 != out_n) {
        __assert_fail("img_n+1 == out_n",
                      "/workspace/llm4binary/github/license_c_cmakelists/RayTracing[P]raytracing/src/external/stb_image.h"
                      ,0xfc9,
                      "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                     );
      }
      if ((byte)uVar11 < 7) {
        local_e8 = local_e8 + lVar8 + lVar22;
        switch(uVar11) {
        case 0:
          sVar6 = x;
          while (sVar6 = sVar6 - 1, sVar6 != 0) {
            for (uVar11 = 0; uVar25 != uVar11; uVar11 = uVar11 + 1) {
              __dest[uVar11] = raw[uVar11];
            }
            __dest[(int)uVar1] = 0xff;
            raw = raw + (int)uVar1;
            __dest = __dest + lVar12;
          }
          break;
        case 1:
          sVar6 = x;
          while (sVar6 = sVar6 - 1, sVar6 != 0) {
            for (uVar11 = 0; uVar25 != uVar11; uVar11 = uVar11 + 1) {
              __dest[uVar11] = __dest[uVar11 + lVar23] + raw[uVar11];
            }
            __dest[(int)uVar1] = 0xff;
            raw = raw + (int)uVar1;
            __dest = __dest + lVar12;
          }
          break;
        case 2:
          sVar6 = x;
          while (sVar6 = sVar6 - 1, sVar6 != 0) {
            for (uVar11 = 0; uVar25 != uVar11; uVar11 = uVar11 + 1) {
              __dest[uVar11] = local_e8[uVar11] + raw[uVar11];
            }
            __dest[(int)uVar1] = 0xff;
            raw = raw + (int)uVar1;
            __dest = __dest + lVar12;
            local_e8 = local_e8 + lVar12;
          }
          break;
        case 3:
          sVar6 = x;
          while (sVar6 = sVar6 - 1, sVar6 != 0) {
            for (uVar11 = 0; uVar25 != uVar11; uVar11 = uVar11 + 1) {
              __dest[uVar11] =
                   (char)((uint)__dest[uVar11 + lVar23] + (uint)local_e8[uVar11] >> 1) + raw[uVar11]
              ;
            }
            __dest[(int)uVar1] = 0xff;
            raw = raw + (int)uVar1;
            __dest = __dest + lVar12;
            local_e8 = local_e8 + lVar12;
          }
          break;
        case 4:
          local_100 = local_100 + lVar8 + lVar23;
          psVar7 = psVar7 + uVar10 + lVar8 + (lVar23 - uVar16);
          sVar6 = x;
          while (sVar6 = sVar6 - 1, sVar6 != 0) {
            for (uVar11 = 0; uVar25 != uVar11; uVar11 = uVar11 + 1) {
              bVar3 = raw[uVar11];
              iVar20 = stbi__paeth((uint)local_100[uVar11],(uint)local_e8[uVar11],
                                   (uint)psVar7[uVar11]);
              __dest[uVar11] = (char)iVar20 + bVar3;
            }
            __dest[(int)uVar1] = 0xff;
            raw = raw + (int)uVar1;
            __dest = __dest + lVar12;
            local_e8 = local_e8 + lVar12;
            local_100 = local_100 + lVar12;
            psVar7 = psVar7 + lVar12;
          }
          break;
        case 5:
          sVar6 = x;
          while (sVar6 = sVar6 - 1, sVar6 != 0) {
            for (uVar11 = 0; uVar25 != uVar11; uVar11 = uVar11 + 1) {
              __dest[uVar11] = (__dest[uVar11 + lVar23] >> 1) + raw[uVar11];
            }
            __dest[(int)uVar1] = 0xff;
            raw = raw + (int)uVar1;
            __dest = __dest + lVar12;
          }
          break;
        case 6:
          sVar6 = x;
          while (sVar6 = sVar6 - 1, sVar6 != 0) {
            for (uVar11 = 0; uVar25 != uVar11; uVar11 = uVar11 + 1) {
              __dest[uVar11] = __dest[uVar11 + lVar23] + raw[uVar11];
            }
            __dest[(int)uVar1] = 0xff;
            raw = raw + (int)uVar1;
            __dest = __dest + lVar12;
          }
        }
      }
    }
    uVar14 = uVar14 + 1;
    uVar5 = uVar15 + uVar5;
  }
LAB_0010f474:
  stbi__g_failure_reason = "Corrupt PNG";
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc(x * y * out_n); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;
   if (s->img_x == x && s->img_y == y) {
      if (raw_len != img_len) return stbi__err("not enough pixels","Corrupt PNG");
   } else { // interlaced:
      if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");
   }

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior = cur - stride;
      int filter = *raw++;
      int filter_bytes = img_n;
      int width = x;
      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*img_n;
         #define CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            CASE(STBI__F_sub)          cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); break;
            CASE(STBI__F_up)           cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            CASE(STBI__F_avg)          cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); break;
            CASE(STBI__F_paeth)        cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); break;
            CASE(STBI__F_avg_first)    cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); break;
            CASE(STBI__F_paeth_first)  cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); break;
         }
         #undef CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[img_n]=255,raw+=img_n,cur+=out_n,prior+=out_n) \
                   for (k=0; k < img_n; ++k)
         switch (filter) {
            CASE(STBI__F_none)         cur[k] = raw[k]; break;
            CASE(STBI__F_sub)          cur[k] = STBI__BYTECAST(raw[k] + cur[k-out_n]); break;
            CASE(STBI__F_up)           cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            CASE(STBI__F_avg)          cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-out_n])>>1)); break;
            CASE(STBI__F_paeth)        cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-out_n],prior[k],prior[k-out_n])); break;
            CASE(STBI__F_avg_first)    cur[k] = STBI__BYTECAST(raw[k] + (cur[k-out_n] >> 1)); break;
            CASE(STBI__F_paeth_first)  cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-out_n],0,0)); break;
         }
         #undef CASE
      }
   }

   // we make a separate pass to expand bits to pixels; for performance,
   // this could run two scanlines behind the above code, so it won't
   // intefere with filtering but will still be in the cache.
   if (depth < 8) {
      for (j=0; j < y; ++j) {
         stbi_uc *cur = a->out + stride*j;
         stbi_uc *in  = a->out + stride*j + x*out_n - img_width_bytes;
         // unpack 1/2/4-bit into a 8-bit buffer. allows us to keep the common 8-bit path optimal at minimal cost for 1/2/4-bit
         // png guarante byte alignment, if width is not multiple of 8/4/2 we'll decode dummy trailing data that will be skipped in the later loop
         stbi_uc scale = (color == 0) ? stbi__depth_scale_table[depth] : 1; // scale grayscale values to 0..255 range

         // note that the final byte might overshoot and write more data than desired.
         // we can allocate enough data that this never writes out of memory, but it
         // could also overwrite the next scanline. can it overwrite non-empty data
         // on the next scanline? yes, consider 1-pixel-wide scanlines with 1-bit-per-pixel.
         // so we need to explicitly clamp the final ones

         if (depth == 4) {
            for (k=x*img_n; k >= 2; k-=2, ++in) {
               *cur++ = scale * ((*in >> 4)       );
               *cur++ = scale * ((*in     ) & 0x0f);
            }
            if (k > 0) *cur++ = scale * ((*in >> 4)       );
         } else if (depth == 2) {
            for (k=x*img_n; k >= 4; k-=4, ++in) {
               *cur++ = scale * ((*in >> 6)       );
               *cur++ = scale * ((*in >> 4) & 0x03);
               *cur++ = scale * ((*in >> 2) & 0x03);
               *cur++ = scale * ((*in     ) & 0x03);
            }
            if (k > 0) *cur++ = scale * ((*in >> 6)       );
            if (k > 1) *cur++ = scale * ((*in >> 4) & 0x03);
            if (k > 2) *cur++ = scale * ((*in >> 2) & 0x03);
         } else if (depth == 1) {
            for (k=x*img_n; k >= 8; k-=8, ++in) {
               *cur++ = scale * ((*in >> 7)       );
               *cur++ = scale * ((*in >> 6) & 0x01);
               *cur++ = scale * ((*in >> 5) & 0x01);
               *cur++ = scale * ((*in >> 4) & 0x01);
               *cur++ = scale * ((*in >> 3) & 0x01);
               *cur++ = scale * ((*in >> 2) & 0x01);
               *cur++ = scale * ((*in >> 1) & 0x01);
               *cur++ = scale * ((*in     ) & 0x01);
            }
            if (k > 0) *cur++ = scale * ((*in >> 7)       );
            if (k > 1) *cur++ = scale * ((*in >> 6) & 0x01);
            if (k > 2) *cur++ = scale * ((*in >> 5) & 0x01);
            if (k > 3) *cur++ = scale * ((*in >> 4) & 0x01);
            if (k > 4) *cur++ = scale * ((*in >> 3) & 0x01);
            if (k > 5) *cur++ = scale * ((*in >> 2) & 0x01);
            if (k > 6) *cur++ = scale * ((*in >> 1) & 0x01);
         }
         if (img_n != out_n) {
            // insert alpha = 255
            stbi_uc *cur = a->out + stride*j;
            int i;
            if (img_n == 1) {
               for (i=x-1; i >= 0; --i) {
                  cur[i*2+1] = 255;
                  cur[i*2+0] = cur[i];
               }
            } else {
               STBI_ASSERT(img_n == 3);
               for (i=x-1; i >= 0; --i) {
                  cur[i*4+3] = 255;
                  cur[i*4+2] = cur[i*3+2];
                  cur[i*4+1] = cur[i*3+1];
                  cur[i*4+0] = cur[i*3+0];
               }
            }
         }
      }
   }

   return 1;
}